

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void measureAllocationSize(sqlite3 *db,void *p)

{
  uint uVar1;
  
  if (((db == (sqlite3 *)0x0) || (p < (db->lookaside).pStart)) || ((db->lookaside).pEnd <= p)) {
    uVar1 = (*sqlite3Config.m.xSize)(p);
  }
  else {
    uVar1 = (uint)(db->lookaside).sz;
  }
  *db->pnBytesFreed = *db->pnBytesFreed + uVar1;
  return;
}

Assistant:

static SQLITE_NOINLINE void measureAllocationSize(sqlite3 *db, void *p){
  *db->pnBytesFreed += sqlite3DbMallocSize(db,p);
}